

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_store_fpr32h(DisasContext_conflict6 *ctx,TCGv_i32 t,int reg)

{
  TCGContext_conflict6 *s;
  TCGTemp *ts;
  
  if ((ctx->hflags & 0x40) == 0) {
    gen_store_fpr32(ctx,t,reg | 1);
    return;
  }
  s = ctx->uc->tcg_ctx;
  ts = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  tcg_gen_extu_i32_i64_mips64el(s,(TCGv_i64)((long)ts - (long)s),t);
  tcg_gen_deposit_i64_mips64el
            (s,s->fpu_f64[(uint)reg],s->fpu_f64[(uint)reg],(TCGv_i64)((long)ts - (long)s),0x20,0x20)
  ;
  tcg_temp_free_internal_mips64el(s,ts);
  return;
}

Assistant:

static void gen_store_fpr32h(DisasContext *ctx, TCGv_i32 t, int reg)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (ctx->hflags & MIPS_HFLAG_F64) {
        TCGv_i64 t64 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_extu_i32_i64(tcg_ctx, t64, t);
        tcg_gen_deposit_i64(tcg_ctx, tcg_ctx->fpu_f64[reg], tcg_ctx->fpu_f64[reg], t64, 32, 32);
        tcg_temp_free_i64(tcg_ctx, t64);
    } else {
        gen_store_fpr32(ctx, t, reg | 1);
    }
}